

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToggleTiles.cpp
# Opt level: O1

void __thiscall commands::ToggleTiles::execute(ToggleTiles *this)

{
  pointer pTVar1;
  ulong uVar2;
  long lVar3;
  Tile tile;
  Tile local_40;
  
  Command::execute(&this->super_Command);
  pTVar1 = (this->toggleData_).
           super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->toggleData_).
      super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Board::accessTile(&local_40,this->board_,(Vector2i *)((long)&(pTVar1->pos).x + lVar3));
      Tile::setState(&local_40,
                     (&((this->toggleData_).
                        super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->newState)[lVar3]);
      if (this->highlightTiles_ == true) {
        Tile::setHighlight(&local_40,true);
      }
      uVar2 = uVar2 + 1;
      pTVar1 = (this->toggleData_).
               super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0xc;
    } while (uVar2 < (ulong)(((long)(this->toggleData_).
                                    super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void ToggleTiles::execute() {
    Command::execute();
    for (size_t i = 0; i < toggleData_.size(); ++i) {
        auto tile = board_.accessTile(toggleData_[i].pos);
        tile.setState(toggleData_[i].newState);
        if (highlightTiles_) {
            tile.setHighlight(true);
        }
    }
}